

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeRestoreCursorPosition(BtCursor *pCur)

{
  int iVar1;
  int local_20;
  int local_1c;
  int skipNext;
  int rc;
  BtCursor *pCur_local;
  
  local_20 = 0;
  if (pCur->eState == '\x04') {
    pCur_local._4_4_ = pCur->skipNext;
  }
  else {
    pCur->eState = '\x01';
    _skipNext = pCur;
    iVar1 = sqlite3FaultSim(0x19a);
    if (iVar1 == 0) {
      local_1c = btreeMoveto(_skipNext,_skipNext->pKey,_skipNext->nKey,0,&local_20);
    }
    else {
      local_1c = 10;
    }
    if (local_1c == 0) {
      sqlite3_free(_skipNext->pKey);
      _skipNext->pKey = (void *)0x0;
      if (local_20 != 0) {
        _skipNext->skipNext = local_20;
      }
      if ((_skipNext->skipNext != 0) && (_skipNext->eState == '\0')) {
        _skipNext->eState = '\x02';
      }
    }
    pCur_local._4_4_ = local_1c;
  }
  return pCur_local._4_4_;
}

Assistant:

static int btreeRestoreCursorPosition(BtCursor *pCur){
  int rc;
  int skipNext = 0;
  assert( cursorOwnsBtShared(pCur) );
  assert( pCur->eState>=CURSOR_REQUIRESEEK );
  if( pCur->eState==CURSOR_FAULT ){
    return pCur->skipNext;
  }
  pCur->eState = CURSOR_INVALID;
  if( sqlite3FaultSim(410) ){
    rc = SQLITE_IOERR;
  }else{
    rc = btreeMoveto(pCur, pCur->pKey, pCur->nKey, 0, &skipNext);
  }
  if( rc==SQLITE_OK ){
    sqlite3_free(pCur->pKey);
    pCur->pKey = 0;
    assert( pCur->eState==CURSOR_VALID || pCur->eState==CURSOR_INVALID );
    if( skipNext ) pCur->skipNext = skipNext;
    if( pCur->skipNext && pCur->eState==CURSOR_VALID ){
      pCur->eState = CURSOR_SKIPNEXT;
    }
  }
  return rc;
}